

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  reference __ptr;
  size_t sVar1;
  undefined8 *in_RCX;
  char *in_RDX;
  allocator_type *in_RSI;
  long in_RDI;
  char **in_stack_00000010;
  uchar *in_stack_00000018;
  EXRVersion *in_stack_00000020;
  EXRHeader *in_stack_00000028;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  size_type in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  size_t local_38;
  FILE *local_30;
  undefined8 *local_28;
  allocator_type *local_18;
  int local_4;
  
  if (((in_RDI == 0) || (in_RSI == (allocator_type *)0x0)) || (in_RDX == (char *)0x0)) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "Invalid argument.";
    }
    local_4 = -3;
  }
  else {
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_30 = fopen(in_RDX,"rb");
    if (local_30 == (FILE *)0x0) {
      if (local_28 != (undefined8 *)0x0) {
        *local_28 = "Cannot read file.";
      }
      local_4 = -6;
    }
    else {
      fseek(local_30,0,2);
      local_38 = ftell(local_30);
      fseek(local_30,0,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1592ff);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x15931f);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_50,0);
      sVar1 = fread(__ptr,1,local_38,local_30);
      fclose(local_30);
      if (sVar1 == local_38) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        local_4 = ParseEXRHeaderFromMemory
                            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010
                            );
        in_stack_ffffffffffffff50 = local_18;
      }
      else {
        if (local_28 != (undefined8 *)0x0) {
          *local_28 = "fread error.";
        }
        local_4 = -5;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff50)
      ;
    }
  }
  return local_4;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      if (err) {
        (*err) = "fread error.";
      }
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, &buf.at(0), err);
}